

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O3

const_iterator __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
::find(map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
       *this,key_type *key)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *peVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  
  uVar10 = 0xcbf29ce484222325;
  pcVar6 = key->data_;
  cVar5 = *pcVar6;
  cVar12 = cVar5;
  pcVar8 = pcVar6;
  if (cVar5 == '\0') {
    uVar10 = 0xcbf29ce484222325;
  }
  else {
    do {
      uVar10 = ((long)cVar12 ^ uVar10) * 0x100000001b3;
      cVar12 = pcVar8[1];
      pcVar8 = pcVar8 + 1;
    } while (cVar12 != '\0');
  }
  lVar3 = 0;
  uVar11 = 0x16;
  do {
    uVar9 = uVar11 >> 1;
    lVar1 = lVar3 + uVar9 * 0x18;
    uVar2 = *(ulong *)((long)&this->data_[uVar9].hash + lVar3);
    if (uVar2 < uVar10) {
      lVar3 = lVar1 + 0x18;
      uVar9 = ~uVar9 + uVar11;
    }
    else if (uVar2 <= uVar10) {
      pcVar8 = *(char **)((long)&this->data_[uVar9].
                                 super_element<mapbox::eternal::string,_unsigned_int>.pair.first.
                                 data_ + lVar3);
      cVar12 = *pcVar8;
      pcVar7 = pcVar6;
      if (cVar12 == '\0') {
        cVar12 = '\0';
      }
      else {
        do {
          pcVar8 = pcVar8 + 1;
          if (cVar12 != *pcVar7) goto LAB_0017f0e4;
          pcVar7 = pcVar7 + 1;
          cVar12 = *pcVar8;
        } while (cVar12 != '\0');
        cVar12 = '\0';
      }
LAB_0017f0e4:
      if (cVar12 < *pcVar7) {
        lVar3 = lVar1 + 0x18;
        uVar9 = uVar11 + ~uVar9;
      }
    }
    uVar11 = uVar9;
  } while (uVar9 != 0);
  if (lVar3 != 0x210) {
    peVar4 = (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
              *)((long)&this->data_[0].super_element<mapbox::eternal::string,_unsigned_int>.pair.
                        first.data_ + lVar3);
    if (peVar4->hash <= uVar10) {
      if (peVar4->hash < uVar10) {
        return (const_iterator)peVar4;
      }
      pcVar8 = (peVar4->super_element<mapbox::eternal::string,_unsigned_int>).pair.first.data_;
      while (cVar5 != '\0') {
        pcVar6 = pcVar6 + 1;
        if (cVar5 != *pcVar8) goto LAB_0017f143;
        pcVar8 = pcVar8 + 1;
        cVar5 = *pcVar6;
      }
      cVar5 = '\0';
LAB_0017f143:
      if (*pcVar8 <= cVar5) {
        return (const_iterator)peVar4;
      }
    }
  }
  return (const_iterator)this[1].data_;
}

Assistant:

find(const key_type& key) const noexcept {
        const compare_key_type compare_key{ key };
        auto it = bound<less>(data_, data_ + N, compare_key);
        if (it != data_ + N && greater_equal()(*it, compare_key)) {
            return it;
        } else {
            return end();
        }
    }